

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::~QMenu(QMenu *this)

{
  long lVar1;
  bool bVar2;
  QMenuPrivate *this_00;
  QWidget **ppQVar3;
  QAction **ppQVar4;
  QMenu *in_RDI;
  long in_FS_OFFSET;
  iterator iVar5;
  QWidgetAction *action;
  QWidget *widget;
  QMenuPrivate *d;
  QWidget *in_stack_00000038;
  iterator it;
  QAction *in_stack_ffffffffffffffb8;
  QWidget *this_01;
  QMenu *this_02;
  Data<QHashPrivate::Node<QAction_*,_QWidget_*>_> *widget_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)&in_RDI->super_QWidget = &PTR_metaObject_00d17d50;
  *(undefined ***)&(in_RDI->super_QWidget).super_QPaintDevice = &PTR__QMenu_00d17f08;
  this_02 = in_RDI;
  this_00 = d_func((QMenu *)0x6463f9);
  bVar2 = QHash<QAction_*,_QWidget_*>::isEmpty(&this_00->widgetItems);
  if (!bVar2) {
    QHash<QAction_*,_QWidget_*>::begin((QHash<QAction_*,_QWidget_*> *)this_00);
    while( true ) {
      iVar5 = QHash<QAction_*,_QWidget_*>::end
                        ((QHash<QAction_*,_QWidget_*> *)in_stack_ffffffffffffffb8);
      widget_00 = iVar5.i.d;
      bVar2 = QHash<QAction_*,_QWidget_*>::iterator::operator!=
                        ((iterator *)in_stack_ffffffffffffffb8,(iterator *)in_RDI);
      if (!bVar2) break;
      ppQVar3 = QHash<QAction_*,_QWidget_*>::iterator::value((iterator *)0x646484);
      this_01 = *ppQVar3;
      if (this_01 != (QWidget *)0x0) {
        ppQVar4 = QHash<QAction_*,_QWidget_*>::iterator::key((iterator *)0x64649e);
        in_stack_ffffffffffffffb8 = *ppQVar4;
        QWidgetAction::releaseWidget((QWidgetAction *)this_02,(QWidget *)widget_00);
        ppQVar3 = QHash<QAction_*,_QWidget_*>::iterator::operator*((iterator *)0x6464bf);
        *ppQVar3 = (QWidget *)0x0;
      }
      QHash<QAction_*,_QWidget_*>::iterator::operator++((iterator *)this_01);
    }
  }
  if (this_00->eventLoop != (QEventLoop *)0x0) {
    QEventLoop::exit((int)this_00->eventLoop);
  }
  hideTearOffMenu(in_RDI);
  QWidget::~QWidget(in_stack_00000038);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QMenu::~QMenu()
{
    Q_D(QMenu);
    if (!d->widgetItems.isEmpty()) {  // avoid detach on shared null hash
        QHash<QAction *, QWidget *>::iterator it = d->widgetItems.begin();
        for (; it != d->widgetItems.end(); ++it) {
            if (QWidget *widget = it.value()) {
                QWidgetAction *action = static_cast<QWidgetAction *>(it.key());
                action->releaseWidget(widget);
                *it = 0;
            }
        }
    }

    if (d->eventLoop)
        d->eventLoop->exit();
    hideTearOffMenu();
}